

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

bool __thiscall
cmCTestCoverageHandler::FindLCovFiles
          (cmCTestCoverageHandler *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files)

{
  pointer pcVar1;
  cmCTest *pcVar2;
  bool bVar3;
  ostream *poVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  string daGlob;
  string buildDir;
  ostringstream cmCTestLog_msg;
  cmWorkingDirectory workdir;
  Glob gl;
  string local_280;
  long *local_260;
  long local_250 [2];
  string local_240;
  undefined1 local_220 [112];
  ios_base local_1b0 [264];
  cmWorkingDirectory local_a8;
  Glob local_80;
  
  cmsys::Glob::Glob(&local_80);
  local_80.Recurse = false;
  local_80.RecurseThroughSymlinks = false;
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  pcVar1 = local_220 + 0x10;
  local_220._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"BuildDirectory","");
  cmCTest::GetCTestConfiguration(&local_240,pcVar2,(string *)local_220);
  if ((pointer)local_220._0_8_ != pcVar1) {
    operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
  }
  cmWorkingDirectory::cmWorkingDirectory(&local_a8,&local_240);
  if (local_a8.ResultCode == 0) {
    local_220._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_220,"profmerge","");
    bVar3 = cmSystemTools::RunSingleCommand
                      ((string *)local_220,(string *)0x0,(string *)0x0,(int *)0x0,(char *)0x0,
                       OUTPUT_MERGE,(cmDuration)0x0);
    if ((pointer)local_220._0_8_ != pcVar1) {
      operator_delete((void *)local_220._0_8_,local_220._16_8_ + 1);
    }
    if (bVar3) {
      local_280._M_string_length = 0;
      local_280.field_2._M_local_buf[0] = '\0';
      local_280._M_dataplus._M_p = (pointer)&local_280.field_2;
      std::__cxx11::string::_M_assign((string *)&local_280);
      std::__cxx11::string::append((char *)&local_280);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_220,"   looking for dpi files in: ",0x1d);
      poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_220,local_280._M_dataplus._M_p,local_280._M_string_length
                         );
      std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
      std::ostream::put((char)poVar4);
      std::ostream::flush();
      pcVar2 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar2,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                   ,0x666,(char *)local_260,(this->super_cmCTestGenericHandler).Quiet);
      if (local_260 != local_250) {
        operator_delete(local_260,local_250[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
      std::ios_base::~ios_base(local_1b0);
      bVar3 = cmsys::Glob::FindFiles(&local_80,&local_280,(GlobMessages *)0x0);
      if (bVar3) {
        pvVar5 = cmsys::Glob::GetFiles_abi_cxx11_(&local_80);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)files,
                   (files->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish,
                   (pvVar5->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start,
                   (pvVar5->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_220,"Now searching in: ",0x12);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_220,local_280._M_dataplus._M_p,
                            local_280._M_string_length);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x66e,(char *)local_260,(this->super_cmCTestGenericHandler).Quiet);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_220,"Error while finding files matching ",0x23);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_220,local_280._M_dataplus._M_p,
                            local_280._M_string_length);
        std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                     ,0x669,(char *)local_260,false);
      }
      if (local_260 != local_250) {
        operator_delete(local_260,local_250[0] + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
      std::ios_base::~ios_base(local_1b0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._M_dataplus._M_p != &local_280.field_2) {
        operator_delete(local_280._M_dataplus._M_p,
                        CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                                 local_280.field_2._M_local_buf[0]) + 1);
      }
      goto LAB_0017d303;
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_220,"Error while running profmerge.\n",0x1f);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x65c,local_280._M_dataplus._M_p,false);
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_220);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_220,"Unable to change working directory to ",0x26);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_220,local_240._M_dataplus._M_p,local_240._M_string_length);
    std::ios::widen((char)poVar4->_vptr_basic_ostream[-3] + (char)poVar4);
    std::ostream::put((char)poVar4);
    std::ostream::flush();
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::stringbuf::str();
    cmCTest::Log(pcVar2,7,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestCoverageHandler.cxx"
                 ,0x656,local_280._M_dataplus._M_p,false);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,
                    CONCAT71(local_280.field_2._M_allocated_capacity._1_7_,
                             local_280.field_2._M_local_buf[0]) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_220);
  std::ios_base::~ios_base(local_1b0);
  bVar3 = false;
LAB_0017d303:
  cmWorkingDirectory::~cmWorkingDirectory(&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  cmsys::Glob::~Glob(&local_80);
  return bVar3;
}

Assistant:

bool cmCTestCoverageHandler::FindLCovFiles(std::vector<std::string>& files)
{
  cmsys::Glob gl;
  gl.RecurseOff(); // No need of recurse if -prof_dir${BUILD_DIR} flag is
                   // used while compiling.
  gl.RecurseThroughSymlinksOff();
  std::string buildDir = this->CTest->GetCTestConfiguration("BuildDirectory");
  cmWorkingDirectory workdir(buildDir);
  if (workdir.Failed()) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Unable to change working directory to " << buildDir
                                                        << std::endl);
    return false;
  }

  // Run profmerge to merge all *.dyn files into dpi files
  if (!cmSystemTools::RunSingleCommand("profmerge")) {
    cmCTestLog(this->CTest, ERROR_MESSAGE, "Error while running profmerge.\n");
    return false;
  }

  // DPI file should appear in build directory
  std::string daGlob;
  daGlob = buildDir;
  daGlob += "/*.dpi";
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "   looking for dpi files in: " << daGlob << std::endl,
                     this->Quiet);
  if (!gl.FindFiles(daGlob)) {
    cmCTestLog(this->CTest, ERROR_MESSAGE,
               "Error while finding files matching " << daGlob << std::endl);
    return false;
  }
  cmAppend(files, gl.GetFiles());
  cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                     "Now searching in: " << daGlob << std::endl, this->Quiet);
  return true;
}